

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O3

planck_unit_result_t
planck_unit_assert_int_are_not_equal
          (planck_unit_test_t *state,int32_t expected,int32_t actual,int line,char *file)

{
  int iVar1;
  char *__s;
  planck_unit_result_t pVar2;
  
  iVar1 = snprintf((char *)0x0,0,"expected not int %ld, got %ld",(ulong)(uint)expected,
                   (ulong)(uint)actual);
  state->allocated_message = '\x01';
  __s = (char *)malloc((long)(iVar1 + 1));
  if ((iVar1 + 1 != 0) && (__s != (char *)0x0)) {
    pVar2 = '\0';
    sprintf(__s,"expected not int %ld, got %ld",(ulong)(uint)expected,(ulong)(uint)actual);
    if (expected != actual) {
      if (state->allocated_message == '\x01') {
        free(__s);
      }
      state->allocated_message = '\0';
      __s = "";
      line = -1;
      pVar2 = '\x01';
    }
    state->result = pVar2;
    state->line = line;
    state->file = file;
    state->message = __s;
    return pVar2;
  }
  free(__s);
  printf("out of memory");
  fflush(_stdout);
  exit(-1);
}

Assistant:

planck_unit_result_t
planck_unit_assert_int_are_not_equal(
	planck_unit_test_t	*state,
	int32_t					expected,
	int32_t					actual,
	int					line,
	const char			*file
) {
	const char	*message;
	int			message_size;
	char		*buffer;

	message						= "expected not int %ld, got %ld";

	message_size				= planck_unit_check_int_space(message, &expected, &actual);
	state->allocated_message	= 1;
	buffer						= malloc(message_size);

	if ((NULL == buffer) || !message_size) {
		free(buffer);
		PLANCK_UNIT_PRINT_STR("out of memory");
		exit(-1);
	}

	sprintf(buffer, message, expected, actual);

	return planck_unit_assert_true(state, expected != actual, line, file, buffer);
}